

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O3

void __thiscall HEkk::clearEkkDataInfo(HEkk *this)

{
  pointer pdVar1;
  pointer piVar2;
  
  pdVar1 = (this->info_).workCost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->info_).workCost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->info_).workCost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  pdVar1 = (this->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  pdVar1 = (this->info_).workShift_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->info_).workShift_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->info_).workShift_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  pdVar1 = (this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  pdVar1 = (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  pdVar1 = (this->info_).workRange_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->info_).workRange_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->info_).workRange_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  pdVar1 = (this->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  pdVar1 = (this->info_).workLowerShift_.super__Vector_base<double,_std::allocator<double>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->info_).workLowerShift_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->info_).workLowerShift_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  pdVar1 = (this->info_).workUpperShift_.super__Vector_base<double,_std::allocator<double>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->info_).workUpperShift_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->info_).workUpperShift_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  pdVar1 = (this->info_).baseLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->info_).baseLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->info_).baseLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  pdVar1 = (this->info_).baseUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->info_).baseUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->info_).baseUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  pdVar1 = (this->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  pdVar1 = (this->info_).numTotRandomValue_.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->info_).numTotRandomValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->info_).numTotRandomValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  piVar2 = (this->info_).numTotPermutation_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->info_).numTotPermutation_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar2) {
    (this->info_).numTotPermutation_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar2;
  }
  piVar2 = (this->info_).numColPermutation_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->info_).numColPermutation_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar2) {
    (this->info_).numColPermutation_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar2;
  }
  piVar2 = (this->info_).devex_index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->info_).devex_index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar2) {
    (this->info_).devex_index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar2;
  }
  pdVar1 = (this->info_).pivot_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->info_).pivot_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->info_).pivot_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  piVar2 = (this->info_).index_chosen_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->info_).index_chosen_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar2) {
    (this->info_).index_chosen_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar2;
  }
  (this->info_).phase1_backtracking_test_done = 0;
  (this->info_).phase2_backtracking_test_done = 0;
  (this->info_).backtracking_ = false;
  (this->info_).valid_backtracking_basis_ = false;
  SimplexBasis::clear(&(this->info_).backtracking_basis_);
  (this->info_).backtracking_basis_costs_shifted_ = 0;
  (this->info_).backtracking_basis_costs_perturbed_ = 0;
  (this->info_).backtracking_basis_bounds_perturbed_ = 0;
  pdVar1 = (this->info_).backtracking_basis_workShift_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if ((this->info_).backtracking_basis_workShift_.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
      != pdVar1) {
    (this->info_).backtracking_basis_workShift_.super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_finish = pdVar1;
  }
  pdVar1 = (this->info_).backtracking_basis_workLowerShift_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if ((this->info_).backtracking_basis_workLowerShift_.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
      != pdVar1) {
    (this->info_).backtracking_basis_workLowerShift_.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         pdVar1;
  }
  pdVar1 = (this->info_).backtracking_basis_workUpperShift_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if ((this->info_).backtracking_basis_workUpperShift_.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
      != pdVar1) {
    (this->info_).backtracking_basis_workUpperShift_.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         pdVar1;
  }
  pdVar1 = (this->info_).backtracking_basis_edge_weight_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if ((this->info_).backtracking_basis_edge_weight_.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
      != pdVar1) {
    (this->info_).backtracking_basis_edge_weight_.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         pdVar1;
  }
  (this->info_).simplex_strategy = 0;
  (this->info_).dual_edge_weight_strategy = 0;
  (this->info_).primal_edge_weight_strategy = 0;
  (this->info_).price_strategy = 0;
  (this->info_).dual_simplex_cost_perturbation_multiplier = 1.0;
  (this->info_).primal_simplex_phase1_cost_perturbation_multiplier = 1.0;
  (this->info_).primal_simplex_bound_perturbation_multiplier = 1.0;
  (this->info_).allow_dual_steepest_edge_to_devex_switch = false;
  (this->info_).dual_steepest_edge_weight_log_error_threshold = 0.0;
  (this->info_).run_quiet = false;
  (this->info_).store_squared_primal_infeasibility = false;
  (this->info_).report_simplex_inner_clock = false;
  (this->info_).report_simplex_outer_clock = false;
  (this->info_).report_simplex_phases_clock = false;
  (this->info_).report_HFactor_clock = false;
  (this->info_).analyse_lp = false;
  (this->info_).analyse_iterations = false;
  (this->info_).analyse_invert_form = false;
  (this->info_).allow_cost_shifting = true;
  (this->info_).allow_cost_perturbation = true;
  (this->info_).allow_bound_perturbation = true;
  (this->info_).costs_shifted = false;
  (this->info_).costs_perturbed = false;
  (this->info_).bounds_perturbed = false;
  (this->info_).num_primal_infeasibilities = -1;
  (this->info_).max_primal_infeasibility = INFINITY;
  (this->info_).sum_primal_infeasibilities = INFINITY;
  (this->info_).num_dual_infeasibilities = -1;
  (this->info_).max_dual_infeasibility = INFINITY;
  (this->info_).sum_dual_infeasibilities = INFINITY;
  (this->info_).dual_phase1_iteration_count = 0;
  (this->info_).dual_phase2_iteration_count = 0;
  (this->info_).primal_phase1_iteration_count = 0;
  (this->info_).primal_phase2_iteration_count = 0;
  (this->info_).primal_bound_swap = 0;
  (this->info_).min_concurrency = 1;
  (this->info_).num_concurrency = 1;
  (this->info_).max_concurrency = 8;
  (this->info_).multi_iteration = 0;
  (this->info_).update_count = 0;
  (this->info_).dual_objective_value = 0.0;
  (this->info_).primal_objective_value = 0.0;
  (this->info_).updated_dual_objective_value = 0.0;
  *(undefined8 *)((long)&(this->info_).updated_dual_objective_value + 4) = 0;
  *(undefined8 *)((long)&(this->info_).updated_primal_objective_value + 4) = 0;
  return;
}

Assistant:

void HEkk::clearEkkDataInfo() {
  HighsSimplexInfo& info = this->info_;
  info.workCost_.clear();
  info.workDual_.clear();
  info.workShift_.clear();
  info.workLower_.clear();
  info.workUpper_.clear();
  info.workRange_.clear();
  info.workValue_.clear();
  info.workLowerShift_.clear();
  info.workUpperShift_.clear();
  info.baseLower_.clear();
  info.baseUpper_.clear();
  info.baseValue_.clear();
  info.numTotRandomValue_.clear();
  info.numTotPermutation_.clear();
  info.numColPermutation_.clear();
  info.devex_index_.clear();
  info.pivot_.clear();
  info.index_chosen_.clear();
  info.phase1_backtracking_test_done = false;
  info.phase2_backtracking_test_done = false;
  info.backtracking_ = false;
  info.valid_backtracking_basis_ = false;
  info.backtracking_basis_.clear();
  info.backtracking_basis_costs_shifted_ = false;
  info.backtracking_basis_costs_perturbed_ = false;
  info.backtracking_basis_bounds_perturbed_ = false;
  info.backtracking_basis_workShift_.clear();
  info.backtracking_basis_workLowerShift_.clear();
  info.backtracking_basis_workUpperShift_.clear();
  info.backtracking_basis_edge_weight_.clear();
  info.simplex_strategy = 0;
  info.dual_edge_weight_strategy = 0;
  info.primal_edge_weight_strategy = 0;
  info.price_strategy = 0;
  info.dual_simplex_cost_perturbation_multiplier = 1;
  info.primal_simplex_phase1_cost_perturbation_multiplier = 1;
  info.primal_simplex_bound_perturbation_multiplier = 1;
  info.allow_dual_steepest_edge_to_devex_switch = 0;
  info.dual_steepest_edge_weight_log_error_threshold = 0;
  info.run_quiet = false;
  info.store_squared_primal_infeasibility = false;
  info.report_simplex_inner_clock = false;
  info.report_simplex_outer_clock = false;
  info.report_simplex_phases_clock = false;
  info.report_HFactor_clock = false;
  info.analyse_lp = false;
  info.analyse_iterations = false;
  info.analyse_invert_form = false;

  info.allow_cost_shifting = true;
  info.allow_cost_perturbation = true;
  info.allow_bound_perturbation = true;
  info.costs_shifted = false;
  info.costs_perturbed = false;
  info.bounds_perturbed = false;

  info.num_primal_infeasibilities = kHighsIllegalInfeasibilityCount;
  info.max_primal_infeasibility = kHighsIllegalInfeasibilityMeasure;
  info.sum_primal_infeasibilities = kHighsIllegalInfeasibilityMeasure;
  info.num_dual_infeasibilities = kHighsIllegalInfeasibilityCount;
  info.max_dual_infeasibility = kHighsIllegalInfeasibilityMeasure;
  info.sum_dual_infeasibilities = kHighsIllegalInfeasibilityMeasure;
  info.dual_phase1_iteration_count = 0;
  info.dual_phase2_iteration_count = 0;
  info.primal_phase1_iteration_count = 0;
  info.primal_phase2_iteration_count = 0;
  info.primal_bound_swap = 0;
  info.min_concurrency = 1;
  info.num_concurrency = 1;
  info.max_concurrency = kSimplexConcurrencyLimit;
  info.multi_iteration = 0;
  info.update_count = 0;
  info.dual_objective_value = 0;
  info.primal_objective_value = 0;
  info.updated_dual_objective_value = 0;
  info.updated_primal_objective_value = 0;
  info.num_basic_logicals = 0;
}